

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O2

void test_list_insert(void)

{
  LIST_NODE **ppLVar1;
  LIST_NODE *pLVar2;
  LIST_NODE *pLVar3;
  DATA *pDVar4;
  DATA *pDVar5;
  int iVar6;
  int iVar7;
  LIST_NODE *pLVar8;
  LIST_NODE *pLVar9;
  LIST_NODE local_58;
  undefined4 local_48;
  LIST_NODE local_40;
  
  local_58.n = &local_58;
  pLVar9 = &local_58;
  local_58.p = &local_58;
  pDVar4 = alloc_data(5);
  (pDVar4->list_node).p = local_58.p;
  (pDVar4->list_node).n = &local_58;
  ppLVar1 = &(local_58.p)->n;
  local_58.p = &pDVar4->list_node;
  *ppLVar1 = &pDVar4->list_node;
  pDVar4 = alloc_data(2);
  pLVar8 = &pDVar4->list_node;
  (pDVar4->list_node).p = &local_58;
  (pDVar4->list_node).n = local_58.n;
  ppLVar1 = &(local_58.n)->p;
  local_58.n = pLVar8;
  *ppLVar1 = pLVar8;
  pDVar5 = alloc_data(3);
  pLVar3 = local_58.n;
  (pDVar5->list_node).p = pLVar8;
  pLVar8 = (pDVar4->list_node).n;
  (pDVar5->list_node).n = pLVar8;
  (pDVar4->list_node).n = &pDVar5->list_node;
  pLVar8->p = &pDVar5->list_node;
  iVar7 = 1;
  pDVar4 = alloc_data(1);
  pLVar2 = local_58.p;
  pLVar8 = pLVar3->p;
  (pDVar4->list_node).p = pLVar8;
  (pDVar4->list_node).n = pLVar3;
  pLVar3->p = &pDVar4->list_node;
  pLVar8->n = &pDVar4->list_node;
  pDVar4 = alloc_data(4);
  pLVar3 = local_58.p;
  pLVar8 = pLVar2->p;
  (pDVar4->list_node).p = pLVar8;
  (pDVar4->list_node).n = pLVar2;
  pLVar2->p = &pDVar4->list_node;
  pLVar8->n = &pDVar4->list_node;
  iVar6 = 6;
  pDVar4 = alloc_data(6);
  (pDVar4->list_node).p = pLVar3;
  pLVar8 = pLVar3->n;
  (pDVar4->list_node).n = pLVar8;
  pLVar3->n = &pDVar4->list_node;
  pLVar8->p = &pDVar4->list_node;
  local_48 = 0x29a;
  (local_58.p)->n = &local_58;
  (local_58.n)->p = &local_58;
  local_40.p = local_58.n;
  local_40.n = (local_58.n)->n;
  (local_58.n)->n = &local_40;
  (local_40.n)->p = &local_40;
  (local_58.n)->n = local_40.n;
  (local_40.n)->p = local_58.n;
  for (pLVar8 = local_58.n; pLVar8 != &local_58; pLVar8 = pLVar8->n) {
    acutest_check_((uint)(iVar7 == *(int *)&pLVar8[-1].n),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x83,"%s","data->value == n");
    iVar7 = iVar7 + 1;
  }
  while (pLVar9 = pLVar9->p, pLVar9 != &local_58) {
    acutest_check_((uint)(iVar6 == *(int *)((long)pLVar9 + -8)),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x89,"%s","data->value == n");
    iVar6 = iVar6 + -1;
  }
  iVar7 = 6;
  while (local_58.n != &local_58) {
    pLVar8 = (local_58.n)->p;
    pLVar9 = (local_58.n)->n;
    pLVar8->n = pLVar9;
    pLVar9->p = pLVar8;
    free(&local_58.n[-1].n);
    iVar7 = iVar7 + -1;
  }
  acutest_check_((uint)(iVar7 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x94,"%s","n == 6");
  return;
}

Assistant:

static void
test_list_insert(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    DATA xxx;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(5)->list_node);                              /* 5 */
    list_prepend(&list, &alloc_data(2)->list_node);                             /* 2 -> 5 */
    list_insert_after(&list, list_head(&list), &alloc_data(3)->list_node);      /* 1 -> 2 -> 3 */
    list_insert_before(&list, list_head(&list), &alloc_data(1)->list_node);     /* 1 -> 2 -> 3 -> 5 */
    list_insert_before(&list, list_tail(&list), &alloc_data(4)->list_node);     /* 1 -> 2 -> 3 -> 4 -> 5 */
    list_insert_after(&list, list_tail(&list), &alloc_data(6)->list_node);      /* 1 -> 2 -> 3 -> 4 -> 5 -> 6 */

    /* Verify that removals do not break integrity. */
    xxx.value = 666;
    list_append(&list, &xxx.list_node);
    list_remove(&list, &xxx.list_node);
    list_prepend(&list, &xxx.list_node);
    list_remove(&list, &xxx.list_node);
    list_insert_after(&list, list_head(&list), &xxx.list_node);
    list_remove(&list, &xxx.list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 6; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 6);
}